

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cc
# Opt level: O2

void __thiscall ipx::Control::hLog(Control *this,string *str)

{
  HighsLogOptions log_options_;
  
  if ((this->parameters_).super_ipx_parameters.highs_logging == true) {
    HighsLogOptions::HighsLogOptions
              (&log_options_,(this->parameters_).super_ipx_parameters.log_options);
    highsLogUser(&log_options_,kInfo,"%s",(str->_M_dataplus)._M_p);
    std::_Function_base::~_Function_base(&log_options_.user_callback.super__Function_base);
    return;
  }
  std::operator<<(&(this->output_).super_ostream,(string *)str);
  return;
}

Assistant:

void Control::hLog(std::string str) const {
  if (parameters_.highs_logging) {
    assert(parameters_.log_options);
    HighsLogOptions log_options_ = *(parameters_.log_options);
    highsLogUser(log_options_, HighsLogType::kInfo, "%s", str.c_str());
  } else {
    output_ << str;
  }

}